

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

void sha384_final(ptls_hash_context_t *_ctx,void *md,ptls_hash_final_mode_t mode)

{
  SHA512_CTX copy;
  SHA512_CTX SStack_f8;
  
  if (mode == PTLS_HASH_FINAL_MODE_SNAPSHOT) {
    memcpy(&SStack_f8,_ctx + 1,0xd8);
    SHA384_Final((uchar *)md,&SStack_f8);
    (*ptls_clear_memory)(&SStack_f8,0xd8);
    return;
  }
  if (md != (void *)0x0) {
    SHA384_Final((uchar *)md,(SHA512_CTX *)(_ctx + 1));
  }
  if (mode != PTLS_HASH_FINAL_MODE_RESET) {
    if (mode == PTLS_HASH_FINAL_MODE_FREE) {
      (*ptls_clear_memory)(_ctx + 1,0xd8);
      free(_ctx);
      return;
    }
    __assert_fail("!\"FIXME\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/../lib/openssl.c"
                  ,0x40b,"void sha384_final(ptls_hash_context_t *, void *, ptls_hash_final_mode_t)")
    ;
  }
  SHA384_Init((SHA512_CTX *)(_ctx + 1));
  return;
}

Assistant:

static int sign_certificate(ptls_sign_certificate_t *_self, ptls_t *tls, uint16_t *selected_algorithm, ptls_buffer_t *outbuf,
                            ptls_iovec_t input, const uint16_t *algorithms, size_t num_algorithms)
{
    ptls_openssl_sign_certificate_t *self = (ptls_openssl_sign_certificate_t *)_self;
    const struct st_ptls_openssl_signature_scheme_t *scheme;

    /* select the algorithm */
    for (scheme = self->schemes; scheme->scheme_id != UINT16_MAX; ++scheme) {
        size_t i;
        for (i = 0; i != num_algorithms; ++i)
            if (algorithms[i] == scheme->scheme_id)
                goto Found;
    }
    return PTLS_ALERT_HANDSHAKE_FAILURE;

Found:
    *selected_algorithm = scheme->scheme_id;
    return do_sign(self->key, outbuf, input, scheme->scheme_md);
}